

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# repeated_field.h
# Opt level: O0

void __thiscall
google::protobuf::internal::RepeatedPtrFieldBase::
MergeFromInnerLoop<google::protobuf::RepeatedPtrField<google::protobuf::EnumDescriptorProto_EnumReservedRange>::TypeHandler>
          (RepeatedPtrFieldBase *this,void **our_elems,void **other_elems,int length,
          int already_allocated)

{
  EnumDescriptorProto_EnumReservedRange *pEVar1;
  int in_ECX;
  long in_RSI;
  EnumDescriptorProto_EnumReservedRange *in_RDI;
  int in_R8D;
  Type *new_elem_1;
  Type *other_elem_1;
  int i_1;
  Arena *arena;
  Type *new_elem;
  Type *other_elem;
  int i;
  undefined7 in_stack_ffffffffffffff98;
  undefined1 uVar2;
  int local_44;
  int local_24;
  
  for (local_24 = 0; uVar2 = local_24 < in_R8D && local_24 < in_ECX,
      local_24 < in_R8D && local_24 < in_ECX; local_24 = local_24 + 1) {
    GenericTypeHandler<google::protobuf::EnumDescriptorProto_EnumReservedRange>::Merge
              (in_RDI,(EnumDescriptorProto_EnumReservedRange *)
                      CONCAT17(uVar2,in_stack_ffffffffffffff98));
  }
  GetArenaNoVirtual((RepeatedPtrFieldBase *)in_RDI);
  for (local_44 = in_R8D; local_44 < in_ECX; local_44 = local_44 + 1) {
    pEVar1 = GenericTypeHandler<google::protobuf::EnumDescriptorProto_EnumReservedRange>::
             NewFromPrototype(in_RDI,(Arena *)CONCAT17(uVar2,in_stack_ffffffffffffff98));
    GenericTypeHandler<google::protobuf::EnumDescriptorProto_EnumReservedRange>::Merge
              (in_RDI,(EnumDescriptorProto_EnumReservedRange *)
                      CONCAT17(uVar2,in_stack_ffffffffffffff98));
    *(EnumDescriptorProto_EnumReservedRange **)(in_RSI + (long)local_44 * 8) = pEVar1;
  }
  return;
}

Assistant:

void RepeatedPtrFieldBase::MergeFromInnerLoop(void** our_elems,
                                              void** other_elems, int length,
                                              int already_allocated) {
  // Split into two loops, over ranges [0, allocated) and [allocated, length),
  // to avoid a branch within the loop.
  for (int i = 0; i < already_allocated && i < length; i++) {
    // Already allocated: use existing element.
    typename TypeHandler::Type* other_elem =
        reinterpret_cast<typename TypeHandler::Type*>(other_elems[i]);
    typename TypeHandler::Type* new_elem =
        reinterpret_cast<typename TypeHandler::Type*>(our_elems[i]);
    TypeHandler::Merge(*other_elem, new_elem);
  }
  Arena* arena = GetArenaNoVirtual();
  for (int i = already_allocated; i < length; i++) {
    // Not allocated: alloc a new element first, then merge it.
    typename TypeHandler::Type* other_elem =
        reinterpret_cast<typename TypeHandler::Type*>(other_elems[i]);
    typename TypeHandler::Type* new_elem =
        TypeHandler::NewFromPrototype(other_elem, arena);
    TypeHandler::Merge(*other_elem, new_elem);
    our_elems[i] = new_elem;
  }
}